

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyle.cpp
# Opt level: O2

void __thiscall QCachedPainter::finish(QCachedPainter *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  QPoint local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  std::__uniq_ptr_impl<QPainter,_std::default_delete<QPainter>_>::reset
            ((__uniq_ptr_impl<QPainter,_std::default_delete<QPainter>_> *)&this->m_pixmapPainter,
             (pointer)0x0);
  if (this->m_pixmapDrawn == false) {
    this->m_pixmapDrawn = true;
    bVar1 = QRect::isNull(&this->m_paintRect);
    if (!bVar1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QPainter::drawPixmap(this->m_painter,&this->m_paintRect,&this->m_pixmap);
        return;
      }
      goto LAB_003371b8;
    }
    local_20.xp.m_i = (this->m_option->rect).x1.m_i;
    local_20.yp.m_i = (this->m_option->rect).y1.m_i;
    QPainter::drawPixmap(this->m_painter,&local_20,&this->m_pixmap);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_003371b8:
  __stack_chk_fail();
}

Assistant:

void QCachedPainter::finish()
{
    m_pixmapPainter.reset();
    if (!m_pixmapDrawn) {
        m_pixmapDrawn = true;
        if (m_paintRect.isNull())
            m_painter->drawPixmap(m_option->rect.topLeft(), m_pixmap);
        else
            m_painter->drawPixmap(m_paintRect, m_pixmap);
    }
}